

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

PackedSlice * __thiscall kratos::VarSlice::operator[](VarSlice *this,string *member_name)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  InternalException *this_00;
  uint32_t *puVar4;
  UserException *pUVar5;
  undefined4 extraout_var;
  ulong uVar6;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  long *local_478;
  PackedSlice *local_468;
  VarSlice *local_410;
  undefined1 local_408 [8];
  shared_ptr<kratos::PackedSlice> p;
  char local_3f0 [32];
  string local_3d0;
  undefined1 local_3a9;
  char local_3a8 [32];
  string local_388;
  long *local_368;
  PackedInterface *packed_1;
  PackedSlice *packed;
  PackedStructFieldDef *def;
  char local_348 [32];
  string local_328;
  long *local_308;
  Var *root;
  char local_2f8 [32];
  string local_2d8;
  undefined1 local_2b5;
  allocator<char> local_2a1;
  string local_2a0;
  string *local_280;
  string *member_name_local;
  VarSlice *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_268;
  basic_string_view<char> local_258;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_220;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  char (*local_210) [25];
  char *local_208;
  string *local_200;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1f8;
  basic_string_view<char> local_1e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char (*local_1a0) [25];
  char *local_198;
  string *local_190;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_188;
  basic_string_view<char> local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_130) [25];
  char *local_128;
  string *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_118;
  basic_string_view<char> local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_c0) [29];
  char *local_b8;
  string *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_70;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_280 = member_name;
  member_name_local = (string *)this;
  if (this->parent_var == (Var *)0x0) {
    local_2b5 = 1;
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Invalid var slice",&local_2a1);
    InternalException::InternalException(this_00,&local_2a0);
    local_2b5 = 0;
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  uVar1 = (*(this->parent_var->super_IRNode)._vptr_IRNode[0x18])();
  if ((uVar1 & 1) != 0) {
    uVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
    puVar4 = Var::var_width(&this->super_Var);
    if (uVar2 == *puVar4) {
      iVar3 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x29])();
      local_308 = (long *)CONCAT44(extraout_var,iVar3);
      uVar6 = (**(code **)(*local_308 + 0xb8))();
      if ((uVar6 & 1) == 0) {
        def._7_1_ = 1;
        pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_348);
        local_b0 = &local_328;
        local_b8 = "Invalid member access{0}.{1}";
        local_c0 = (char (*) [29])local_348;
        vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_280;
        fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[29],char>
                  (&local_f8,(v7 *)"Invalid member access{0}.{1}",local_c0,local_280,in_R8);
        local_d0 = &local_f8;
        local_108 = fmt::v7::to_string_view<char,_0>(local_b8);
        local_a0 = &local_118;
        local_a8 = local_d0;
        local_20 = local_d0;
        local_10 = local_d0;
        local_18 = local_a0;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_a0,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_d0);
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_118.field_1.values_;
        format_str_00.size_ = local_118.desc_;
        format_str_00.data_ = (char *)local_108.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_328,(detail *)local_108.data_,format_str_00,args_00);
        UserException::UserException(pUVar5,&local_328);
        def._7_1_ = 0;
        __cxa_throw(pUVar5,&UserException::typeinfo,UserException::~UserException);
      }
      uVar1 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x17])();
      if ((uVar1 & 1) == 0) {
        if (local_308 == (long *)0x0) {
          local_478 = (long *)0x0;
        }
        else {
          local_478 = (long *)__dynamic_cast(local_308,&Var::typeinfo,&PackedInterface::typeinfo,
                                             0xfffffffffffffffe);
        }
        local_368 = local_478;
        if (local_478 == (long *)0x0) {
          local_3a9 = 1;
          pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
          (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_3a8);
          local_190 = &local_388;
          local_198 = "Unable to access {0}.{1}";
          local_1a0 = (char (*) [25])local_3a8;
          vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_280;
          fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[25],char>
                    (&local_1d8,(v7 *)"Unable to access {0}.{1}",local_1a0,local_280,in_R8);
          local_1b0 = &local_1d8;
          local_1e8 = fmt::v7::to_string_view<char,_0>(local_198);
          local_80 = &local_1f8;
          local_88 = local_1b0;
          local_50 = local_1b0;
          local_40 = local_1b0;
          local_48 = local_80;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_80,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_1b0);
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_1f8.field_1.values_;
          format_str_01.size_ = local_1f8.desc_;
          format_str_01.data_ = (char *)local_1e8.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_388,(detail *)local_1e8.data_,format_str_01,args_01);
          UserException::UserException(pUVar5,&local_388);
          local_3a9 = 0;
          __cxa_throw(pUVar5,&UserException::typeinfo,UserException::~UserException);
        }
        packed = (PackedSlice *)(**(code **)(*local_478 + 8))(local_478,local_280);
        if (packed == (PackedSlice *)0x0) {
          p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = 1;
          pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
          (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_3f0);
          local_200 = &local_3d0;
          local_208 = "Unable to access {0}.{1}";
          local_210 = (char (*) [25])local_3f0;
          vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_280;
          fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[25],char>
                    (&local_248,(v7 *)"Unable to access {0}.{1}",local_210,local_280,in_R8);
          local_220 = &local_248;
          local_258 = fmt::v7::to_string_view<char,_0>(local_208);
          local_70 = &local_268;
          local_78 = local_220;
          local_68 = local_220;
          local_58 = local_220;
          local_60 = local_70;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_70,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_220);
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_268.field_1.values_;
          format_str_02.size_ = local_268.desc_;
          format_str_02.data_ = (char *)local_258.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_3d0,(detail *)local_258.data_,format_str_02,args_02);
          UserException::UserException(pUVar5,&local_3d0);
          p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = 0;
          __cxa_throw(pUVar5,&UserException::typeinfo,UserException::~UserException);
        }
        local_410 = this;
        std::
        make_shared<kratos::PackedSlice,kratos::VarSlice*,kratos::PackedStructFieldDef_const*&,std::__cxx11::string_const&>
                  ((VarSlice **)local_408,(PackedStructFieldDef **)&local_410,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&packed);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)&(this->super_Var).slices_,(shared_ptr<kratos::PackedSlice> *)local_408);
        this_local = &std::
                      __shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_408)->super_VarSlice;
        std::shared_ptr<kratos::PackedSlice>::~shared_ptr
                  ((shared_ptr<kratos::PackedSlice> *)local_408);
      }
      else {
        if (this == (VarSlice *)0x0) {
          local_468 = (PackedSlice *)0x0;
        }
        else {
          local_468 = (PackedSlice *)__dynamic_cast(this,&typeinfo,&PackedSlice::typeinfo,0);
        }
        packed_1 = (PackedInterface *)local_468;
        this_local = &PackedSlice::slice_member(local_468,local_280)->super_VarSlice;
      }
      return (PackedSlice *)this_local;
    }
  }
  root._7_1_ = 1;
  pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_2f8);
  local_120 = &local_2d8;
  local_128 = "Unable to access {0}.{1}";
  local_130 = (char (*) [25])local_2f8;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_280;
  fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[25],char>
            (&local_168,(v7 *)"Unable to access {0}.{1}",local_130,local_280,in_R8);
  local_140 = &local_168;
  local_178 = fmt::v7::to_string_view<char,_0>(local_128);
  local_90 = &local_188;
  local_98 = local_140;
  local_38 = local_140;
  local_28 = local_140;
  local_30 = local_90;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_90,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_140);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_188.field_1.values_;
  format_str.size_ = local_188.desc_;
  format_str.data_ = (char *)local_178.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_2d8,(detail *)local_178.data_,format_str,args);
  UserException::UserException(pUVar5,&local_2d8);
  root._7_1_ = 0;
  __cxa_throw(pUVar5,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

PackedSlice &VarSlice::operator[](const std::string &member_name) {
    if (!parent_var) throw InternalException("Invalid var slice");
    if (!parent_var->is_packed() || width() != var_width())
        throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto *root = get_var_root_parent();
    if (!root->is_struct())
        throw UserException(::format("Invalid member access{0}.{1}", to_string(), member_name));
    const PackedStructFieldDef *def;
    if (is_struct()) {
        auto *packed = dynamic_cast<PackedSlice *>(this);
        return packed->slice_member(member_name);
    } else {
        auto *packed = dynamic_cast<PackedInterface *>(root);
        if (!packed)
            throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
        def = packed->get_definition(member_name);
    }

    if (!def) throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto p = std::make_shared<PackedSlice>(this, def, member_name);
    slices_.emplace_back(p);
    return *p;
}